

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O1

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  IntegralConvertResult IVar1;
  uint uVar2;
  FormatConversionSpecImpl conv;
  
  if (arg.buf[0] != '\x13') {
    if ((2L << ((byte)(FormatSinkImpl *)((ulong)arg.ptr & 0xffffffff) & 0x3f) & 0x9fe00U) != 0) {
      uVar2 = spec._0_4_;
      conv.width_ = 0;
      conv.conv_ = (char)uVar2;
      conv.flags_ = (char)(uVar2 >> 8);
      conv.length_mod_ = (char)(uVar2 >> 0x10);
      conv._3_1_ = (char)(uVar2 >> 0x18);
      conv.precision_ = spec.precision_;
      IVar1 = str_format_internal::FormatConvertImpl
                        ((str_format_internal *)arg.ptr,(double)this,conv,
                         (FormatSinkImpl *)((ulong)arg.ptr & 0xffffffff));
      goto LAB_003a931e;
    }
  }
  IVar1.value = false;
LAB_003a931e:
  return (bool)(IVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }